

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_>::read_next
          (basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  basic_json_visitor<char> *pbVar1;
  
  pbVar1 = (this->cursor_handler_adaptor_).destination_;
  (this->cursor_handler_adaptor_).destination_ = visitor;
  (this->parser_).more_ = true;
  do {
    basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
              (&this->parser_,&(this->cursor_handler_adaptor_).super_basic_item_event_visitor<char>,
               ec);
    if (ec->_M_value != 0) break;
  } while (((this->parser_).more_ & 1U) != 0);
  (this->cursor_handler_adaptor_).destination_ = pbVar1;
  return;
}

Assistant:

void read_next(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        {
            struct resource_wrapper
            {
                basic_item_event_visitor_to_json_visitor<char_type,Allocator>& adaptor;
                basic_json_visitor<char_type>& original;

                resource_wrapper(basic_item_event_visitor_to_json_visitor<char_type,Allocator>& adaptor,
                                 basic_json_visitor<char_type>& visitor)
                    : adaptor(adaptor), original(adaptor.destination())
                {
                    adaptor.destination(visitor);
                }

                ~resource_wrapper()
                {
                    adaptor.destination(original);
                }
            } wrapper(cursor_handler_adaptor_, visitor);

            parser_.restart();
            while (!parser_.stopped())
            {
                parser_.parse(cursor_handler_adaptor_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
            }
        }
    }